

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O0

void duckdb_je_arena_migrate(tsd_t *tsd,arena_t *oldarena,arena_t *newarena)

{
  uint uVar1;
  arena_t *in_RDX;
  arena_t *in_RSI;
  long in_RDI;
  uint8_t state;
  arena_t *in_stack_ffffffffffffffa8;
  
  duckdb_je_arena_nthreads_dec(in_RSI,false);
  duckdb_je_arena_nthreads_inc(in_RDX,false);
  *(arena_t **)(in_RDI + 0x90) = in_RDX;
  uVar1 = duckdb_je_arena_nthreads_get(in_RSI,false);
  if (uVar1 == 0) {
    duckdb_je_arena_decay((tsdn_t *)in_RDX,in_stack_ffffffffffffffa8,false,false);
  }
  return;
}

Assistant:

void
arena_migrate(tsd_t *tsd, arena_t *oldarena, arena_t *newarena) {
	assert(oldarena != NULL);
	assert(newarena != NULL);

	arena_nthreads_dec(oldarena, false);
	arena_nthreads_inc(newarena, false);
	tsd_arena_set(tsd, newarena);

	if (arena_nthreads_get(oldarena, false) == 0) {
		/* Purge if the old arena has no associated threads anymore. */
		arena_decay(tsd_tsdn(tsd), oldarena,
		    /* is_background_thread */ false, /* all */ true);
	}
}